

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O1

char * __thiscall
Messages::Person_PhoneNumber::_InternalParse(Person_PhoneNumber *this,char *ptr,ParseContext *ctx)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte bVar2;
  string *psVar3;
  StringPiece SVar4;
  undefined1 auVar5 [12];
  bool bVar6;
  char cVar7;
  Arena *arena;
  UnknownFieldSet *pUVar8;
  uint uVar9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [16];
  byte *local_40;
  InternalMetadata *local_38;
  
  local_38 = (InternalMetadata *)&this->field_0x8;
  this_00 = &this->number_;
  local_40 = (byte *)ptr;
  do {
    bVar6 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
    if (bVar6) {
      return (char *)local_40;
    }
    bVar1 = *local_40;
    auVar10[8] = bVar1;
    auVar10._0_8_ = local_40 + 1;
    auVar10._9_3_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = local_40[1];
      uVar9 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        auVar10 = google::protobuf::internal::ReadTagFallback((char *)local_40,uVar9);
      }
      else {
        auVar10._8_4_ = uVar9;
        auVar10._0_8_ = local_40 + 2;
      }
    }
    uVar9 = auVar10._8_4_;
    local_40 = auVar10._0_8_;
    cVar7 = '\x04';
    if (local_40 != (byte *)0x0) {
      if (uVar9 >> 3 == 2) {
        if (auVar10[8] != '\x10') goto LAB_00108123;
        bVar1 = *local_40;
        auVar11._8_8_ = (long)(char)bVar1;
        auVar11._0_8_ = local_40 + 1;
        auVar5 = auVar11._0_12_;
        if ((long)(char)bVar1 < 0) {
          bVar2 = local_40[1];
          uVar9 = ((uint)bVar2 * 0x80 + (uint)bVar1) - 0x80;
          if ((char)bVar2 < '\0') {
            auVar11 = google::protobuf::internal::VarintParseSlow64((char *)local_40,uVar9);
            auVar5 = auVar11._0_12_;
          }
          else {
            auVar5._8_4_ = uVar9;
            auVar5._0_8_ = local_40 + 2;
          }
        }
        local_40 = auVar5._0_8_;
        if (local_40 != (byte *)0x0) {
          if (auVar5._8_4_ < 3) {
            *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
            this->type_ = auVar5._8_4_;
          }
          else {
            _InternalParse();
          }
          cVar7 = '\x02';
        }
      }
      else if ((uVar9 >> 3 == 1) && (auVar10[8] == '\n')) {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        arena = *(Arena **)&this->field_0x8;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
        }
        if (this_00->ptr_ ==
            (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstance
                    (this_00,arena,
                     (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        }
        psVar3 = this_00->ptr_;
        local_40 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                     ((string *)psVar3,(char *)local_40,ctx);
        SVar4.ptr_ = (psVar3->_M_dataplus)._M_p;
        SVar4.length_ = psVar3->_M_string_length;
        if ((long)psVar3->_M_string_length < 0) {
          google::protobuf::StringPiece::LogFatalSizeTooBig
                    (psVar3->_M_string_length,"size_t to int conversion");
        }
        google::protobuf::internal::VerifyUTF8(SVar4,"Messages.Person.PhoneNumber.number");
        cVar7 = (local_40 == (byte *)0x0) * '\x02' + '\x02';
      }
      else {
LAB_00108123:
        if (uVar9 == 0 || (uVar9 & 7) == 4) {
          *(uint *)&ctx->field_0x50 = uVar9 - 1;
          cVar7 = '\a';
        }
        else {
          if (((ulong)local_38->ptr_ & 1) == 0) {
            pUVar8 = google::protobuf::internal::InternalMetadata::
                     mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(local_38);
          }
          else {
            pUVar8 = (UnknownFieldSet *)(((ulong)local_38->ptr_ & 0xfffffffffffffffe) + 8);
          }
          local_40 = (byte *)google::protobuf::internal::UnknownFieldParse
                                       ((ulong)uVar9,pUVar8,(char *)local_40,ctx);
          cVar7 = (local_40 == (byte *)0x0) * '\x02' + '\x02';
        }
      }
    }
    if (cVar7 != '\x02') {
      if (cVar7 == '\x04') {
        local_40 = (byte *)0x0;
      }
      return (char *)local_40;
    }
  } while( true );
}

Assistant:

const char* Person_PhoneNumber::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // required string number = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_number();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "Messages.Person.PhoneNumber.number");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .Messages.Person.PhoneType type = 2 [default = HOME];
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(::Messages::Person_PhoneType_IsValid(val))) {
            _internal_set_type(static_cast<::Messages::Person_PhoneType>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(2, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}